

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O1

QToken * queryparse::transform_hexbyte(QToken *__return_storage_ptr__,node *atom)

{
  uint8_t val;
  int iVar1;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             (atom->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content.
             begin_.data,
             (atom->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content.end_.
             data);
  if ((char)*local_40[0] == '?') {
    if (*(char *)((long)local_40[0] + 1) == '?') {
      QToken::wildcard();
    }
    else {
      iVar1 = hex2int(*(char *)((long)local_40[0] + 1));
      QToken::high_wildcard(__return_storage_ptr__,(uint8_t)iVar1);
    }
  }
  else if (*(char *)((long)local_40[0] + 1) == '?') {
    iVar1 = hex2int((char)*local_40[0]);
    QToken::low_wildcard(__return_storage_ptr__,(char)iVar1 << 4);
  }
  else {
    val = transform_char(atom);
    QToken::single(__return_storage_ptr__,val);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

QToken transform_hexbyte(const parse_tree::node &atom) {
    const std::string &c = atom.content();

    if (c[0] == '?' && c[1] == '?') {  // \x??
        return QToken::wildcard();
    }
    if (c[0] == '?') {  // \x?A
        return QToken::high_wildcard(hex2int(c[1]));
    }
    if (c[1] == '?') {  // \xA?
        return QToken::low_wildcard(hex2int(c[0]) << 4U);
    }
    return QToken::single(transform_char(atom));
}